

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

void testing::internal::UniversalTersePrinter<const_char_*>::Print(char *str,ostream *os)

{
  size_t sVar1;
  long in_FS_OFFSET;
  char *local_50;
  size_t local_48;
  char local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (str == (char *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
      return;
    }
  }
  else {
    local_50 = local_40;
    sVar1 = strlen(str);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,str,str + sVar1);
    PrintCharsAsStringTo<char>(local_50,local_48,os);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void Print(const char* str, ::std::ostream* os) {
                if (str == NULL) {
                    *os << "NULL";
                }
                else {
                    UniversalPrint(string(str), os);
                }
            }